

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall
xe::TestNode::TestNode(TestNode *this,TestGroup *parent,TestNodeType nodeType,char *name,char *desc)

{
  TestGroup *pTVar1;
  iterator iVar2;
  Error *this_00;
  allocator<char> local_d9;
  key_type local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_00138cc0;
  this->m_parent = parent;
  this->m_nodeType = nodeType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_name,name,(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,desc,(allocator<char> *)&local_d8);
  if (this->m_parent != (TestGroup *)0x0) {
    local_b8 = &this->m_name;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,name,(allocator<char> *)&local_b0);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(parent->m_childNames)._M_t,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(parent->m_childNames)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Duplicate node \'",&local_d9);
      std::operator+(&local_50,&local_70,name);
      std::operator+(&local_b0,&local_50,"\' in \'");
      getFullPath_abi_cxx11_(&local_90,&parent->super_TestNode);
      std::operator+(&local_d8,&local_b0,&local_90);
      Error::Error(this_00,&local_d8);
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_d8._M_dataplus._M_p = (pointer)this;
    std::vector<xe::TestNode*,std::allocator<xe::TestNode*>>::emplace_back<xe::TestNode*>
              ((vector<xe::TestNode*,std::allocator<xe::TestNode*>> *)&this->m_parent->m_children,
               (TestNode **)&local_d8);
    pTVar1 = this->m_parent;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,name,(allocator<char> *)&local_b0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pTVar1->m_childNames,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

TestNode::TestNode (TestGroup* parent, TestNodeType nodeType, const char* name, const char* desc)
	: m_parent		(parent)
	, m_nodeType	(nodeType)
	, m_name		(name)
	, m_description	(desc)
{
	if (m_parent)
	{
		// Verify that the name is unique.
		if (parent->m_childNames.find(name) != parent->m_childNames.end())
			throw Error(std::string("Duplicate node '") + name + "' in '" + parent->getFullPath());

		m_parent->m_children.push_back(this);
		m_parent->m_childNames.insert(name);
	}
}